

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  nk_bool nVar1;
  code *in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float value;
  float max_value;
  float min_value;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  long lVar2;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float local_34;
  float local_30;
  int local_2c;
  
  if (((in_RDI != 0) && (in_RCX != (code *)0x0)) && (in_R8D != 0)) {
    local_34 = (float)(*in_RCX)(in_RDX,in_R9D);
    local_30 = local_34;
    for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
      in_stack_ffffffffffffffc0 = (float)(*in_RCX)(in_RDX,local_2c + in_R9D);
      in_stack_ffffffffffffffc4 = local_30;
      if (in_stack_ffffffffffffffc0 < local_30) {
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc0;
      }
      if (in_stack_ffffffffffffffc0 < local_34) {
        in_stack_ffffffffffffffc0 = local_34;
      }
      local_34 = in_stack_ffffffffffffffc0;
      local_30 = in_stack_ffffffffffffffc4;
    }
    nVar1 = nk_chart_begin((nk_context *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (nk_chart_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (int)in_stack_ffffffffffffffb8,0.0,1.845607e-39);
    if (nVar1 != 0) {
      for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
        lVar2 = in_RDI;
        (*in_RCX)(in_RDX,local_2c + in_R9D);
        nk_chart_push((nk_context *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (float)((ulong)lVar2 >> 0x20));
      }
      nk_chart_end((nk_context *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
float(*value_getter)(void* user, int index), int count, int offset)
{
int i = 0;
float min_value;
float max_value;

NK_ASSERT(ctx);
NK_ASSERT(value_getter);
if (!ctx || !value_getter || !count) return;

max_value = min_value = value_getter(userdata, offset);
for (i = 0; i < count; ++i) {
float value = value_getter(userdata, i + offset);
min_value = NK_MIN(value, min_value);
max_value = NK_MAX(value, max_value);
}

if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
for (i = 0; i < count; ++i)
nk_chart_push(ctx, value_getter(userdata, i + offset));
nk_chart_end(ctx);
}
}